

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O0

void __thiscall FileTest::Test4(FileTest *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined1 local_d0 [8];
  File f2;
  uint local_90;
  uint local_8c;
  int j;
  int i;
  uint8_t *file_data;
  File f;
  undefined1 local_30 [8];
  Path p;
  FileTest *this_local;
  
  p.mPath.field_2._8_8_ = this;
  JetHead::Path::Path((Path *)local_30,"tmp4");
  JetHead::Path::touch();
  JetHead::File::File((File *)&file_data);
  JetHead::File::open((Path *)&file_data,(int)local_30);
  fillFile(this,(File *)&file_data);
  JetHead::File::close();
  JetHead::File::open((Path *)&file_data,(int)local_30);
  lVar2 = JetHead::File::mmap();
  if (lVar2 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1c3,"Failed to map file");
  }
  lVar3 = JetHead::File::getLength();
  if (lVar3 != 0x600) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1c6,"file incorrect length");
  }
  for (local_8c = 0; (int)local_8c < 6; local_8c = local_8c + 1) {
    if (*(byte *)(lVar2 + (int)(local_8c << 8)) != local_8c) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
                 ,0x1cb,"Failed to validate file data with mmap");
    }
    for (local_90 = 1; (int)local_90 < 0x100; local_90 = local_90 + 1) {
      if (*(byte *)(lVar2 + (int)(local_8c * 0x100 + local_90)) != local_90) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
                   ,0x1d4,"Failed to validate file data with mmap");
      }
    }
  }
  *(undefined1 *)(lVar2 + 100) = 5;
  JetHead::File::msync();
  JetHead::File::File((File *)local_d0);
  JetHead::File::open((Path *)local_d0,(int)local_30);
  bVar1 = validateFile(this,(File *)local_d0);
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1e1,"mmap modified file not changed on disk");
  }
  JetHead::File::close();
  JetHead::File::munmap();
  JetHead::File::close();
  lVar2 = JetHead::File::mmap();
  if (lVar2 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1eb,"Calling mmap on closed file worked...");
  }
  JetHead::File::~File((File *)local_d0);
  JetHead::File::~File((File *)&file_data);
  JetHead::Path::~Path((Path *)local_30);
  return;
}

Assistant:

void FileTest::Test4()
{
	Path p( "tmp4" );
	p.touch();
	File f;
	
	f.open( p, File::OF_WRITE );

	// fill the file with 1536 bytes of data.	
	fillFile( f );

	f.close();
	
	f.open( p, File::OF_RDWR );

	uint8_t *file_data = f.mmap();
	
	if ( file_data == NULL )
		TestFailed( "Failed to map file" );
		
	if ( f.getLength() != 1536 )
		TestFailed( "file incorrect length" );
		
	for ( int i = 0; i < 6; i++ )
	{
		if ( file_data[ i * 256 ] != i )
			TestFailed( "Failed to validate file data with mmap" );

		LOG_INFO( "byte one good" );
		
		for ( int j = 1; j < 256; j++ )
		{
			if ( file_data[ ( i * 256 ) + j ] != j )
			{
				LOG_INFO( "Failed at byte %d", j );
				TestFailed( "Failed to validate file data with mmap" );
			}
		}
	}
	
	file_data[ 100 ] = 5;
	
	f.msync();

	File f2;
	f2.open( p );
	
	if ( validateFile( f2 ) )
		TestFailed( "mmap modified file not changed on disk" );
	
	f2.close();
	
	f.munmap();
	f.close();

	file_data = f.mmap();
	
	if ( file_data != NULL )
		TestFailed( "Calling mmap on closed file worked..." );
}